

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

bool anon_unknown.dwarf_1b8a13::CAPIExternalCommand::isResultValid::FallbackContext::handle
               (void *c_ctx,llb_buildsystem_command_t *c_command,llb_build_value *c_value)

{
  BuildSystem *system_00;
  bool bVar1;
  BuildValue *value_00;
  BuildSystem *system;
  FallbackContext *ctx;
  CAPIBuildValue *value;
  CAPIExternalCommand *command;
  llb_build_value *c_value_local;
  llb_buildsystem_command_t *c_command_local;
  void *c_ctx_local;
  
  system_00 = *c_ctx;
  if (c_ctx != (void *)0x0) {
    operator_delete(c_ctx,8);
  }
  value_00 = CAPIBuildValue::getInternalBuildValue((CAPIBuildValue *)c_value);
  bVar1 = llbuild::buildsystem::ExternalCommand::isResultValid
                    ((ExternalCommand *)c_command,system_00,value_00);
  return bVar1;
}

Assistant:

static bool handle(void* c_ctx,
                           llb_buildsystem_command_t* c_command,
                           llb_build_value* c_value) {
          auto* command = (CAPIExternalCommand*)c_command;
          auto* value = (CAPIBuildValue*)c_value;
          
          auto* ctx = static_cast<FallbackContext*>(c_ctx);
          BuildSystem& system = *ctx->buildSystem;
          delete ctx;
          
          return command->ExternalCommand::isResultValid(system, value->getInternalBuildValue());
        }